

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O3

void __thiscall Refal2::CUnit::Print(CUnit *this,ostream *outputStream,CPrintHelper *printHelper)

{
  TUnitType TVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  TChar local_19;
  
  TVar1 = this->type;
  if ((int)TVar1 < 0x10) {
    switch(TVar1) {
    case UT_Char:
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\'",1);
      local_19 = (this->field_1).c;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(outputStream,&local_19,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' ",2);
      return;
    case UT_Label:
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
      (*printHelper->_vptr_CPrintHelper[1])(printHelper,outputStream,(ulong)(this->field_1).number);
      pcVar4 = "/ ";
      goto LAB_001326e8;
    default:
switchD_001325ce_caseD_3:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                    ,0x59,"void Refal2::CUnit::Print(std::ostream &, const CPrintHelper &) const");
    case UT_Number:
      std::__ostream_insert<char,std::char_traits<char>>(outputStream,"/",1);
      outputStream = std::ostream::_M_insert<unsigned_long>((ulong)outputStream);
      pcVar4 = "/ ";
      lVar3 = 2;
      break;
    case UT_Variable:
      (**printHelper->_vptr_CPrintHelper)(printHelper,outputStream,(ulong)(this->field_1).number);
      pcVar4 = " ";
      lVar3 = 1;
    }
  }
  else {
    if ((int)TVar1 < 0x40) {
      if (TVar1 == UT_LeftParen) {
        pcVar4 = "( ";
      }
      else {
        if (TVar1 != UT_RightParen) goto switchD_001325ce_caseD_3;
        pcVar4 = ") ";
      }
    }
    else if (TVar1 == UT_LeftBracket) {
      pcVar4 = "< ";
    }
    else {
      if (TVar1 != UT_RightBracket) goto switchD_001325ce_caseD_3;
      pcVar4 = "> ";
    }
LAB_001326e8:
    lVar3 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,pcVar4,lVar3);
  return;
}

Assistant:

void CUnit::Print( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	switch( GetType() ) {
		case UT_Char:
			outputStream << "'" << Char() << "' ";
			break;
		case UT_Label:
			outputStream << "/";
			printHelper.Label( outputStream, Label() );
			outputStream << "/ ";
			break;
		case UT_Number:
			outputStream << "/" << Number() << "/ ";
			break;
		case UT_Variable:
			printHelper.Variable( outputStream, Variable() );
			outputStream << " ";
			break;
		case UT_LeftParen:
			outputStream << "( ";
			break;
		case UT_RightParen:
			outputStream << ") ";
			break;
		case UT_LeftBracket:
			outputStream << "< ";
			break;
		case UT_RightBracket:
			outputStream << "> ";
			break;
		default:
			assert( false );
			break;
	}
}